

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ValueTest::checkIsLess(ValueTest *this,Value *x,Value *y)

{
  bool bVar1;
  int iVar2;
  Value *in_RDX;
  undefined8 in_RSI;
  Value *in_RDI;
  TestResult *unaff_retaddr;
  Value *in_stack_00000028;
  Value *in_stack_ffffffffffffffd8;
  uint line;
  Value *file;
  
  line = (uint)((ulong)in_RSI >> 0x20);
  file = in_RDI;
  bVar1 = Json::Value::operator<(in_stack_00000028,(Value *)this);
  if (!bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator>(in_RDI,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator<=(in_RDI,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator>=(in_RDI,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator==(in_stack_00000028,(Value *)this);
  if (bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator==(in_stack_00000028,(Value *)this);
  if (bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator>=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator<=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator>(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  bVar1 = Json::Value::operator<(in_stack_00000028,(Value *)this);
  if (bVar1) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  iVar2 = Json::Value::compare(in_RDX,in_RDI);
  if (-1 < iVar2) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  iVar2 = Json::Value::compare(in_RDX,in_RDI);
  if (iVar2 < 0) {
    JsonTest::TestResult::addFailure(unaff_retaddr,(char *)file,line,(char *)in_RDX);
  }
  return;
}

Assistant:

void ValueTest::checkIsLess(const Json::Value& x, const Json::Value& y) {
  JSONTEST_ASSERT(x < y);
  JSONTEST_ASSERT(y > x);
  JSONTEST_ASSERT(x <= y);
  JSONTEST_ASSERT(y >= x);
  JSONTEST_ASSERT(!(x == y));
  JSONTEST_ASSERT(!(y == x));
  JSONTEST_ASSERT(!(x >= y));
  JSONTEST_ASSERT(!(y <= x));
  JSONTEST_ASSERT(!(x > y));
  JSONTEST_ASSERT(!(y < x));
  JSONTEST_ASSERT(x.compare(y) < 0);
  JSONTEST_ASSERT(y.compare(x) >= 0);
}